

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

float common_embd_similarity_cos(float *embd1,float *embd2,int n)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (n < 1) {
    dVar4 = 0.0;
    dVar5 = 0.0;
    dVar6 = 0.0;
  }
  else {
    dVar4 = 0.0;
    dVar5 = 0.0;
    dVar6 = 0.0;
    uVar2 = 0;
    do {
      fVar3 = embd1[uVar2];
      fVar1 = embd2[uVar2];
      dVar6 = dVar6 + (double)(fVar3 * fVar1);
      dVar4 = dVar4 + (double)(fVar3 * fVar3);
      dVar5 = dVar5 + (double)(fVar1 * fVar1);
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  if (((dVar4 == 0.0) && (!NAN(dVar4))) || ((dVar5 == 0.0 && (!NAN(dVar5))))) {
    if (dVar4 == 0.0 && dVar5 == 0.0) {
      fVar3 = 1.0;
    }
    else {
      fVar3 = 0.0;
    }
  }
  else {
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    fVar3 = (float)(dVar6 / (dVar4 * dVar5));
  }
  return fVar3;
}

Assistant:

float common_embd_similarity_cos(const float * embd1, const float * embd2, int n){
    double sum  = 0.0;
    double sum1 = 0.0;
    double sum2 = 0.0;

    for (int i = 0; i < n; i++) {
        sum  += embd1[i] * embd2[i];
        sum1 += embd1[i] * embd1[i];
        sum2 += embd2[i] * embd2[i];
    }

    // Handle the case where one or both vectors are zero vectors
    if (sum1 == 0.0 || sum2 == 0.0) {
        if (sum1 == 0.0 && sum2 == 0.0) {
            return 1.0f; // two zero vectors are similar
        }
        return 0.0f;
    }

    return sum / (sqrt(sum1) * sqrt(sum2));
}